

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O3

void __thiscall
soplex::SPxSolverBase<double>::computeDualfarkas4Row
          (SPxSolverBase<double> *this,double direction,SPxId enterId)

{
  Nonzero<double> *pNVar1;
  int iVar2;
  int iVar3;
  UpdateVector<double> *pUVar4;
  long lVar5;
  SPxId spxid;
  DataKey local_70;
  double local_68;
  ulong uStack_60;
  DataKey local_50;
  double local_48;
  DataKey local_40;
  DataKey local_38;
  
  local_68 = *(double *)(&DAT_005f4190 + (ulong)(0.0 < direction) * 8);
  uStack_60 = 0;
  (this->dualFarkas).super_SVectorBase<double>.memused = 0;
  iVar2 = (this->theFvec->thedelta).super_IdxSet.num;
  iVar3 = -1;
  if (-1 < iVar2) {
    iVar3 = iVar2;
  }
  local_50 = enterId.super_DataKey;
  local_40 = enterId.super_DataKey;
  spx_realloc<soplex::Nonzero<double>*>(&(this->dualFarkas).theelem,iVar3 + 1);
  pUVar4 = this->theFvec;
  (this->dualFarkas).super_SVectorBase<double>.m_elem = (this->dualFarkas).theelem;
  (this->dualFarkas).super_SVectorBase<double>.memsize = iVar3 + 1;
  (this->dualFarkas).super_SVectorBase<double>.memused = 0;
  if (0 < (pUVar4->thedelta).super_IdxSet.num) {
    lVar5 = 0;
    do {
      local_70 = (this->super_SPxBasisBase<double>).theBaseId.data
                 [(pUVar4->thedelta).super_IdxSet.idx[lVar5]].super_DataKey;
      if (local_70.info < 0) {
        SPxRowId::SPxRowId((SPxRowId *)&local_38,(SPxId *)&local_70);
        iVar2 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                          (&(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                            super_SVSetBase<double>.set,&local_38);
        local_48 = (this->theFvec->thedelta).super_VectorBase<double>.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start
                   [(this->theFvec->thedelta).super_IdxSet.idx[lVar5]] * local_68;
        DSVectorBase<double>::makeMem(&this->dualFarkas,1);
        if ((local_48 != 0.0) || (NAN(local_48))) {
          iVar3 = (this->dualFarkas).super_SVectorBase<double>.memused;
          pNVar1 = (this->dualFarkas).super_SVectorBase<double>.m_elem;
          pNVar1[iVar3].idx = iVar2;
          pNVar1[iVar3].val = local_48;
          (this->dualFarkas).super_SVectorBase<double>.memused = iVar3 + 1;
        }
        pUVar4 = this->theFvec;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < (pUVar4->thedelta).super_IdxSet.num);
  }
  if (local_50.info < 0) {
    SPxRowId::SPxRowId((SPxRowId *)&local_70,(SPxId *)&local_40);
    iVar3 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                      (&(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                        super_SVSetBase<double>.set,&local_70);
    local_68 = -local_68;
    uStack_60 = uStack_60 ^ 0x8000000000000000;
    DSVectorBase<double>::makeMem(&this->dualFarkas,1);
    iVar2 = (this->dualFarkas).super_SVectorBase<double>.memused;
    pNVar1 = (this->dualFarkas).super_SVectorBase<double>.m_elem;
    pNVar1[iVar2].idx = iVar3;
    pNVar1[iVar2].val = local_68;
    (this->dualFarkas).super_SVectorBase<double>.memused = iVar2 + 1;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::computeDualfarkas4Row(R direction, SPxId enterId)
{
   R sign = (direction > 0 ? -1.0 : 1.0);

   dualFarkas.clear();
   dualFarkas.setMax(fVec().delta().size() + 1);

   for(int j = 0; j < fVec().delta().size(); ++j)
   {
      SPxId spxid = this->baseId(fVec().idx().index(j));

      if(spxid.isSPxRowId())
         dualFarkas.add(this->number(SPxRowId(spxid)), sign * fVec().delta().value(j));
   }

   if(enterId.isSPxRowId())
      dualFarkas.add(this->number(SPxRowId(enterId)), -sign);
}